

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O0

Matrix3d * ins_ekf::RPYToRotMat(Matrix3d *__return_storage_ptr__,Vector3d *rpy)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar2;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90 [3];
  double local_78;
  double local_70;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_68;
  double local_48;
  double sy;
  double cy;
  double sp;
  double cp;
  double sr;
  double cr;
  Vector3d *rpy_local;
  Matrix3d *rot_I_to_B;
  
  cr = (double)rpy;
  rpy_local = (Vector3d *)__return_storage_ptr__;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(__return_storage_ptr__);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,0);
  sr = cos(*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,0);
  cp = sin(*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,1);
  sp = cos(*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,1);
  cy = sin(*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,2);
  sy = cos(*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)cr,2);
  local_48 = sin(*pdVar1);
  local_70 = sp * sy;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)__return_storage_ptr__,
             &local_70);
  local_78 = sp * local_48;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_68,&local_78);
  local_90[0] = -cy;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,local_90);
  local_98 = cp * cy * sy - sr * local_48;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_98);
  local_a0 = cp * cy * local_48 + sr * sy;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_a0);
  local_a8 = cp * sp;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_a8);
  local_b0 = sr * cy * sy + cp * local_48;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_b0);
  local_b8 = sr * cy * local_48 - cp * sy;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_b8);
  local_c0 = sr * sp;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_c0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d RPYToRotMat(const Eigen::Vector3d& rpy){

        Eigen::Matrix3d rot_I_to_B; // inertial frame to body frame
        double cr   = cos(rpy[0]);
        double sr   = sin(rpy[0]);
        double cp   = cos(rpy[1]);
        double sp   = sin(rpy[1]);
        double cy   = cos(rpy[2]);
        double sy   = sin(rpy[2]);

        rot_I_to_B << cp*cy, cp*sy, -sp,
                sr*sp*cy - cr*sy, sr*sp*sy + cr*cy, sr*cp,
                cr*sp*cy + sr*sy, cr*sp*sy - sr*cy, cr*cp;

        return rot_I_to_B;
    }